

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_ModifyIf_Test::TestBody
          (ParallelFlatHashSet_ModifyIf_Test *this)

{
  internal iVar1;
  bool bVar2;
  size_t in_RCX;
  anon_class_1_0_00000001 *f;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  f_00;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  pointer *__ptr;
  hasher *in_R8;
  char *message;
  key_equal *in_R9;
  AssertionResult AVar3;
  initializer_list<phmap::priv::(anonymous_namespace)::Entry> iVar4;
  size_t offset;
  int val;
  Set m;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> in_stack_fffffffffffffca8;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> kVar5;
  AssertHelper local_350;
  Message local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  undefined1 local_338 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  int local_314;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  local_310;
  
  local_338._0_4_ = 1;
  local_338._4_4_ = 7;
  pbStack_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x900000002;
  iVar4._M_len = 2;
  iVar4._M_array = (iterator)local_338;
  parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
                       *)&local_310,iVar4,in_RCX,in_R8,in_R9,
                      (allocator_type *)in_stack_fffffffffffffca8);
  local_338._0_4_ = 2;
  local_338._4_4_ = 0;
  iVar1 = (internal)
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
          ::
          modify_if<phmap::priv::(anonymous_namespace)::Entry,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_ModifyIf_Test::TestBody()::__0&>
                    ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
                      *)&local_310,(key_arg<phmap::priv::(anonymous_namespace)::Entry> *)local_338,f
                    );
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_348.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffca8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_338,(internal *)&local_348,
               (AssertionResult *)"m.modify_if(Entry{2}, set_value)","false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x39,(char *)local_338);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&stack0xfffffffffffffca8);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_338 != (undefined1  [8])&local_328) {
      operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
    }
    if (in_stack_fffffffffffffca8 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)in_stack_fffffffffffffca8 + 8))();
    }
    if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_340,local_340);
    }
  }
  local_314 = 0;
  kVar5.key = 2;
  kVar5.value = 0;
  bVar2 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          ::find_impl<phmap::priv::(anonymous_namespace)::Entry>
                    (&local_310.sets_._M_elems[5].set_,
                     (key_arg<phmap::priv::(anonymous_namespace)::Entry> *)&stack0xfffffffffffffca8,
                     0x712ee8ab0cd78e1e,(size_t *)local_338);
  if (local_310.sets_._M_elems[5].set_.slots_ == (slot_type *)0x0 || !bVar2) {
    local_348.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         (uint)local_348.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._1_3_ << 8;
    local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&stack0xfffffffffffffca8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_338,(internal *)&local_348,(AssertionResult *)0x20c8b2,"false","true"
               ,(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x3d,(char *)local_338);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&stack0xfffffffffffffca8);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_338 != (undefined1  [8])&local_328) {
      operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
    }
    if (kVar5 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)kVar5 + 8))();
    }
    if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_340,local_340);
    }
  }
  else {
    local_314 = local_310.sets_._M_elems[5].set_.slots_[(long)local_338].value;
  }
  local_348.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xb;
  AVar3 = testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_338,"val","11",&local_314,(int *)&local_348);
  f_00._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_338[0] == (internal)0x0) {
    testing::Message::Message(&local_348);
    if (pbStack_330 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (pbStack_330->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffca8,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffca8);
    f_00 = extraout_RDX.
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    if ((long *)CONCAT44(local_348.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_348.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_348.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_348.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
      f_00._M_head_impl = extraout_RDX_00;
    }
  }
  if (pbStack_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_330,pbStack_330);
    f_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  local_338._0_4_ = 3;
  local_338._4_4_ = 0;
  bVar2 = parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
          ::
          modify_if<phmap::priv::(anonymous_namespace)::Entry,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_ModifyIf_Test::TestBody()::__0&>
                    ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
                      *)&local_310,(key_arg<phmap::priv::(anonymous_namespace)::Entry> *)local_338,
                     (anon_class_1_0_00000001 *)f_00._M_head_impl);
  local_348.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_348.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,!bVar2);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffca8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_338,(internal *)&local_348,
               (AssertionResult *)"m.modify_if(Entry{3}, set_value)","true","false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x40,(char *)local_338);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&stack0xfffffffffffffca8);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_338 != (undefined1  [8])&local_328) {
      operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
    }
    if (kVar5 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)kVar5 + 8))();
    }
    if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_340,local_340);
    }
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::~parallel_hash_set(&local_310);
  return;
}

Assistant:

Entry(int k, int v=0) : key(k), value(v) {}